

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

Forms * __thiscall
curlpp::HttpPost::getList_abi_cxx11_(Forms *__return_storage_ptr__,HttpPost *this)

{
  _List_node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node._M_size = 0;
  p_Var1 = (_List_node_base *)&this->mForms;
  while (p_Var1 = (((_List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->mForms) {
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

curlpp::Forms curlpp::HttpPost::getList()
{
  //I'm not sure cloning is absolutely necessary.
  Forms newForm;

  Forms::const_iterator pos;
  for(pos = mForms.begin(); pos != mForms.end(); pos++) 
    newForm.push_back(*pos);

  return newForm;
}